

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.h
# Opt level: O0

void lzham::lzham_delete_array<unsigned_char>(uchar *p)

{
  long in_RDI;
  uint32 num_check;
  uint32 num;
  
  if ((in_RDI != 0) && (*(uint *)(in_RDI + -4) == (*(uint *)(in_RDI + -8) ^ 0xffffffff))) {
    lzham_free((void *)0x11d8e6);
  }
  return;
}

Assistant:

inline void lzham_delete_array(T* p)
   {
      if (p)
      {
         const uint32 num = reinterpret_cast<uint32*>(p)[-1];
         const uint32 num_check = reinterpret_cast<uint32*>(p)[-2];
         LZHAM_ASSERT(num && (num == ~num_check));
         if (num == ~num_check)
         {
            if (!LZHAM_IS_SCALAR_TYPE(T))
            {
               helpers::destruct_array(p, num);
            }

            lzham_free(reinterpret_cast<uint8*>(p) - LZHAM_MIN_ALLOC_ALIGNMENT);
         }
      }
   }